

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::validateUnderOverlay(QPDFJob *this,QPDF *pdf,UnderOverlay *uo)

{
  ulong i;
  ulong i_00;
  QPDFPageDocumentHelper uo_pdh;
  QPDFPageDocumentHelper main_pdh;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_110 [2];
  QPDFPageDocumentHelper local_d0 [4];
  QPDFPageDocumentHelper local_50;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_50,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_d0,
             &local_50);
  i_00 = ((long)local_d0[0].super_QPDFDocumentHelper.qpdf -
          (long)local_d0[0].super_QPDFDocumentHelper._vptr_QPDFDocumentHelper >> 3) *
         0x6db6db6db6db6db7;
  if ((i_00 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i_00);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_d0);
  processFile(this,&uo->pdf,(uo->filename)._M_dataplus._M_p,
              (uo->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true,false)
  ;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            (local_d0,(uo->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  QPDFPageDocumentHelper::getAllPages(local_110,local_d0);
  i = ((long)local_110[0].
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)local_110[0].
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_110);
  QUtil::parse_numrange
            ((vector<int,_std::allocator<int>_> *)local_110,(uo->to_nr)._M_dataplus._M_p,(int)i_00);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&uo->to_pagenos,local_110);
  if (local_110[0].super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110[0].
                    super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110[0].
                          super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110[0].
                          super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((uo->from_nr)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&uo->from_nr);
  }
  QUtil::parse_numrange
            ((vector<int,_std::allocator<int>_> *)local_110,(uo->from_nr)._M_dataplus._M_p,(int)i);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&uo->from_pagenos,local_110);
  if (local_110[0].super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110[0].
                    super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110[0].
                          super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110[0].
                          super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((uo->repeat_nr)._M_string_length != 0) {
    QUtil::parse_numrange
              ((vector<int,_std::allocator<int>_> *)local_110,(uo->repeat_nr)._M_dataplus._M_p,
               (int)i);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&uo->repeat_pagenos,local_110);
    if (local_110[0].super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110[0].
                      super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_110[0].
                            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110[0].
                            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(local_d0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_50);
  return;
}

Assistant:

void
QPDFJob::validateUnderOverlay(QPDF& pdf, UnderOverlay* uo)
{
    QPDFPageDocumentHelper main_pdh(pdf);
    int main_npages = QIntC::to_int(main_pdh.getAllPages().size());
    processFile(uo->pdf, uo->filename.c_str(), uo->password.get(), true, false);
    QPDFPageDocumentHelper uo_pdh(*(uo->pdf));
    int uo_npages = QIntC::to_int(uo_pdh.getAllPages().size());
    try {
        uo->to_pagenos = QUtil::parse_numrange(uo->to_nr.c_str(), main_npages);
    } catch (std::runtime_error& e) {
        throw std::runtime_error(
            "parsing numeric range for " + uo->which + " \"to\" pages: " + e.what());
    }
    try {
        if (uo->from_nr.empty()) {
            QTC::TC("qpdf", "QPDFJob from_nr from repeat_nr");
            uo->from_nr = uo->repeat_nr;
        }
        uo->from_pagenos = QUtil::parse_numrange(uo->from_nr.c_str(), uo_npages);
        if (!uo->repeat_nr.empty()) {
            uo->repeat_pagenos = QUtil::parse_numrange(uo->repeat_nr.c_str(), uo_npages);
        }
    } catch (std::runtime_error& e) {
        throw std::runtime_error(
            "parsing numeric range for " + uo->which + " file " + uo->filename + ": " + e.what());
    }
}